

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O2

bool benchmark::ParseDoubleFlag(char *str,char *flag,double *value)

{
  bool bVar1;
  char *str_00;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = false;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_48,"The value of flag --",&local_69);
    std::operator+(&local_68,&local_48,flag);
    bVar1 = ParseDouble(&local_68,str_00,value);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar1;
}

Assistant:

bool ParseDoubleFlag(const char* str, const char* flag, double* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseDouble(std::string("The value of flag --") + flag, value_str,
                     value);
}